

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::setPixelsDXT(Image *this,int32 type,uint8 *pixels)

{
  uint8 *pixels_local;
  int32 type_local;
  Image *this_local;
  
  if (type == 1) {
    decompressDXT1(this->pixels,this->width,this->height,pixels);
  }
  else if (type == 3) {
    decompressDXT3(this->pixels,this->width,this->height,pixels);
  }
  else if (type == 5) {
    decompressDXT5(this->pixels,this->width,this->height,pixels);
  }
  return;
}

Assistant:

void
Image::setPixelsDXT(int32 type, uint8 *pixels)
{
	switch(type){
	case 1:
		decompressDXT1(this->pixels, this->width, this->height, pixels);
		break;
	case 3:
		decompressDXT3(this->pixels, this->width, this->height, pixels);
		break;
	case 5:
		decompressDXT5(this->pixels, this->width, this->height, pixels);
		break;
	}
}